

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O3

int checkurl(char *url,char *out)

{
  int iVar1;
  
  iVar1 = strcmp(out,url);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"Wanted: %s\nGot   : %s\n",out,url);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int checkurl(const char *url, const char *out)
{
  if(strcmp(out, url)) {
    fprintf(stderr, "Wanted: %s\nGot   : %s\n",
            out, url);
    return 1;
  }
  return 0;
}